

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> __thiscall
ELFIO::elfio::create_header(elfio *this,uchar file_class,uchar encoding)

{
  elfio *this_00;
  uchar in_CL;
  int iVar1;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  long lVar2;
  
  lVar2 = CONCAT71(in_register_00000031,file_class);
  iVar1 = (int)CONCAT71(in_register_00000011,encoding);
  if (iVar1 == 1) {
    this_00 = (elfio *)operator_new(0x50,(nothrow_t *)&std::nothrow);
    if (this_00 != (elfio *)0x0) {
      elf_header_impl<ELFIO::Elf32_Ehdr>::elf_header_impl
                ((elf_header_impl<ELFIO::Elf32_Ehdr> *)this_00,
                 (endianness_convertor *)(lVar2 + 0x50),in_CL,(address_translator *)(lVar2 + 0x58));
      goto LAB_00109cd8;
    }
  }
  else if (iVar1 == 2) {
    this_00 = (elfio *)operator_new(0x58,(nothrow_t *)&std::nothrow);
    if (this_00 != (elfio *)0x0) {
      elf_header_impl<ELFIO::Elf64_Ehdr>::elf_header_impl
                ((elf_header_impl<ELFIO::Elf64_Ehdr> *)this_00,
                 (endianness_convertor *)(lVar2 + 0x50),in_CL,(address_translator *)(lVar2 + 0x58));
      goto LAB_00109cd8;
    }
  }
  this_00 = (elfio *)0x0;
LAB_00109cd8:
  (this->sections).parent = this_00;
  return (__uniq_ptr_data<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>,_true,_true>)
         (__uniq_ptr_data<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<elf_header> create_header( unsigned char file_class,
                                               unsigned char encoding )
    {
        std::unique_ptr<elf_header> new_header;

        if ( file_class == ELFCLASS64 ) {
            new_header = std::unique_ptr<elf_header>(
                new ( std::nothrow ) elf_header_impl<Elf64_Ehdr>(
                    &convertor, encoding, &addr_translator ) );
        }
        else if ( file_class == ELFCLASS32 ) {
            new_header = std::unique_ptr<elf_header>(
                new ( std::nothrow ) elf_header_impl<Elf32_Ehdr>(
                    &convertor, encoding, &addr_translator ) );
        }
        else {
            return nullptr;
        }

        return new_header;
    }